

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O0

void __thiscall
vigra::BmpInfoHeader::from_stream(BmpInfoHeader *this,ifstream *stream,byteorder *bo)

{
  int iVar1;
  char *in_RDX;
  long in_RSI;
  ifstream *in_RDI;
  uint max_colors;
  UInt32 info_impl_size;
  byteorder *in_stack_ffffffffffffffc8;
  undefined3 uVar2;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  int line;
  
  uVar3 = 0x28;
  read_field<unsigned_int>(in_RDI,in_stack_ffffffffffffffc8,(uint *)0x14e474);
  throw_precondition_error
            (SUB81((ulong)in_RSI >> 0x38,0),in_RDX,(char *)CONCAT44(uVar3,in_stack_ffffffffffffffe0)
             ,in_stack_ffffffffffffffdc);
  read_field<int>(in_RDI,in_stack_ffffffffffffffc8,(int *)0x14e4b5);
  throw_precondition_error
            (SUB81((ulong)in_RSI >> 0x38,0),in_RDX,(char *)CONCAT44(uVar3,in_stack_ffffffffffffffe0)
             ,in_stack_ffffffffffffffdc);
  read_field<int>(in_RDI,in_stack_ffffffffffffffc8,(int *)0x14e4f7);
  throw_precondition_error
            (SUB81((ulong)in_RSI >> 0x38,0),in_RDX,(char *)CONCAT44(uVar3,in_stack_ffffffffffffffe0)
             ,in_stack_ffffffffffffffdc);
  read_field<unsigned_short>(in_RDI,in_stack_ffffffffffffffc8,(unsigned_short *)0x14e539);
  throw_precondition_error
            (SUB81((ulong)in_RSI >> 0x38,0),in_RDX,(char *)CONCAT44(uVar3,in_stack_ffffffffffffffe0)
             ,in_stack_ffffffffffffffdc);
  read_field<unsigned_short>(in_RDI,in_stack_ffffffffffffffc8,(unsigned_short *)0x14e57e);
  uVar2 = (undefined3)in_stack_ffffffffffffffdc;
  line = CONCAT13(1,uVar2);
  if (((*(short *)(in_RDI + 0xe) != 1) && (line = CONCAT13(1,uVar2), *(short *)(in_RDI + 0xe) != 4))
     && (line = CONCAT13(1,uVar2), *(short *)(in_RDI + 0xe) != 8)) {
    line = CONCAT13(*(short *)(in_RDI + 0xe) == 0x18,uVar2);
  }
  throw_precondition_error
            (SUB81((ulong)in_RSI >> 0x38,0),in_RDX,(char *)CONCAT44(uVar3,in_stack_ffffffffffffffe0)
             ,line);
  read_field<unsigned_int>(in_RDI,in_stack_ffffffffffffffc8,(uint *)0x14e607);
  read_field<unsigned_int>(in_RDI,in_stack_ffffffffffffffc8,(uint *)0x14e61f);
  if (*(int *)(in_RDI + 0x14) == 0) {
    iVar1 = 1;
    if (*(short *)(in_RDI + 0xe) == 0x18) {
      iVar1 = 3;
    }
    *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 8) * *(int *)(in_RDI + 4) * iVar1;
  }
  read_field<int>(in_RDI,in_stack_ffffffffffffffc8,(int *)0x14e668);
  read_field<int>(in_RDI,in_stack_ffffffffffffffc8,(int *)0x14e680);
  read_field<unsigned_int>(in_RDI,in_stack_ffffffffffffffc8,(uint *)0x14e698);
  iVar1 = 1 << ((byte)*(undefined2 *)(in_RDI + 0xe) & 0x1f);
  throw_precondition_error(SUB81((ulong)in_RSI >> 0x38,0),in_RDX,(char *)CONCAT44(uVar3,iVar1),line)
  ;
  read_field<unsigned_int>(in_RDI,in_stack_ffffffffffffffc8,(uint *)0x14e6ee);
  throw_precondition_error(SUB81((ulong)in_RSI >> 0x38,0),in_RDX,(char *)CONCAT44(uVar3,iVar1),line)
  ;
  std::istream::seekg(in_RSI,*(int *)in_RDI - 0x28);
  return;
}

Assistant:

void BmpInfoHeader::from_stream( std::ifstream & stream, byteorder & bo )
{
    const UInt32 info_impl_size = 40;
    read_field( stream, bo, info_size );
    vigra_precondition( info_size >= info_impl_size,
                        "info header has a wrong size" );
    read_field( stream, bo, width );
    vigra_precondition( width > 0, "width must be > 0" );
    read_field( stream, bo, height );
    vigra_precondition( height > 0, "height must be > 0" );
    read_field( stream, bo, planes );
    vigra_precondition( planes == 1, "planes must be 1" );
    read_field( stream, bo, bit_count );
    vigra_precondition( bit_count == 1 || bit_count == 4 || bit_count == 8
                        || bit_count == 24, "illegal bit count" );
    read_field( stream, bo, compression );
    read_field( stream, bo, image_size );
    if(image_size == 0)
    {
        image_size = height * width * ((bit_count == 24) ? 3 : 1);
    }
    read_field( stream, bo, x_pixels_per_meter );
    read_field( stream, bo, y_pixels_per_meter );
    read_field( stream, bo, clr_used );
    const unsigned int max_colors = 1 << bit_count;
    vigra_precondition( clr_used <= max_colors,
                        "used colors field invalid" );
    read_field( stream, bo, clr_important );
    vigra_precondition( clr_important <= max_colors,
                        "important colors field invalid" );
    // skip any padding
    stream.seekg( info_size - info_impl_size, std::ios::cur );
}